

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckMapLinks(TidyDocImpl *doc,Node *node)

{
  Node *node_00;
  Bool BVar1;
  AttVal *av;
  ctmbstr url;
  
  if ((doc->access).PRIORITYCHK == 3) {
    for (node_00 = node->content; node_00 != (Node *)0x0; node_00 = node_00->next) {
      if ((node_00->tag != (Dict *)0x0) && (node_00->tag->id == TidyTag_AREA)) {
        av = prvTidyAttrGetById(node_00,TidyAttr_HREF);
        BVar1 = hasValue(av);
        if ((BVar1 != no) && (BVar1 = FindLinkA(doc,(Node *)av->value,url), BVar1 == no)) {
          prvTidyReportAccessError(doc,node,0x2ac);
        }
      }
    }
  }
  return;
}

Assistant:

static void CheckMapLinks( TidyDocImpl* doc, Node* node )
{
    Node* child;

    if (!Level3_Enabled( doc ))
        return;

    /* Stores the 'HREF' link of an AREA element within a MAP element */
    for ( child = node->content; child != NULL; child = child->next )
    {
        if ( nodeIsAREA(child) )
        {
            /* Checks for 'HREF' attribute */                
            AttVal* href = attrGetHREF( child );
            if ( hasValue(href) &&
                 !FindLinkA( doc, &doc->root, href->value ) )
            {
                TY_(ReportAccessError)( doc, node, IMG_MAP_CLIENT_MISSING_TEXT_LINKS );
            }
        }
    }
}